

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O2

void __thiscall pg::ZLKQSolver::ZLKQSolver(ZLKQSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__ZLKQSolver_0019d580;
  (this->Q).pointer = 0;
  this->iterations = 0;
  (this->Q).queue = (uint *)0x0;
  auVar1 = SUB6432(ZEXT464(0) << 0x40,0);
  auVar2 = SUB6432(ZEXT464(0) << 0x40,0x20);
  (this->W0)._bits = (uint64_t *)auVar1._0_8_;
  (this->W0)._size = auVar1._8_8_;
  (this->W0)._bitssize = auVar1._16_8_;
  (this->W0)._allocsize = auVar1._24_8_;
  (this->W1)._bits = (uint64_t *)auVar2._0_8_;
  (this->W1)._size = auVar2._8_8_;
  (this->W1)._bitssize = auVar2._16_8_;
  (this->W1)._allocsize = auVar2._24_8_;
  return;
}

Assistant:

ZLKQSolver::ZLKQSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}